

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O0

string * __thiscall
just::process::exit_reason_abi_cxx11_(string *__return_storage_ptr__,process *this,int status_)

{
  ostream *poVar1;
  allocator<char> local_319;
  ostringstream local_318 [8];
  ostringstream s_1;
  allocator<char> local_19d [13];
  ostringstream local_190 [8];
  ostringstream s;
  byte bStack_13;
  int status__local;
  
  if ((char)(((byte)this & 0x7f) + 1) >> 1 < '\x01') {
    if (((ulong)this & 0x80) == 0) {
      if (((uint)this & 0xff) == 0x7f) {
        std::__cxx11::ostringstream::ostringstream(local_318);
        poVar1 = std::operator<<((ostream *)local_318,"\nProcess was stopped with signal ");
        bStack_13 = (byte)((ulong)this >> 8);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)bStack_13);
        std::operator<<(poVar1,".");
        std::__cxx11::ostringstream::str();
        std::__cxx11::ostringstream::~ostringstream(local_318);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",&local_319);
        std::allocator<char>::~allocator(&local_319);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"\nProcess core dumped.",local_19d);
      std::allocator<char>::~allocator(local_19d);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar1 = std::operator<<((ostream *)local_190,"\nProcess died due to unhandled signal ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this & 0x7f);
    std::operator<<(poVar1,".");
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string exit_reason(int status_)
    {
      if (WIFSIGNALED(status_))
      {
        std::ostringstream s;
        s << "\nProcess died due to unhandled signal " << WTERMSIG(status_)
          << ".";
        return s.str();
      }
      else if (WCOREDUMP(status_))
      {
        return "\nProcess core dumped.";
      }
      else if (WIFSTOPPED(status_))
      {
        std::ostringstream s;
        s << "\nProcess was stopped with signal " << WSTOPSIG(status_) << ".";
        return s.str();
      }
      else
      {
        return "";
      }
    }